

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

bool jessilib::equalsi<char32_t,char>
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> lhs,
               basic_string_view<char,_std::char_traits<char>_> rhs)

{
  wchar32 wVar1;
  char32_t cVar2;
  jessilib *pjVar3;
  size_t sVar4;
  jessilib *this;
  size_t sVar5;
  char *pcVar6;
  decode_result dVar7;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  
  pcVar6 = rhs._M_str;
  pjVar3 = (jessilib *)rhs._M_len;
  this = pjVar3;
  if (lhs._M_len != 0) {
    sVar5 = 0;
    do {
      if (this == (jessilib *)0x0) {
        return false;
      }
      wVar1 = lhs._M_str[sVar5];
      in_string._M_str = (char *)pjVar3;
      in_string._M_len = (size_t)pcVar6;
      dVar7 = decode_codepoint_utf8<char>(this,in_string);
      sVar4 = dVar7.units;
      if (sVar4 == 0) {
        return false;
      }
      if (wVar1 != dVar7.codepoint) {
        cVar2 = jessilib::fold(wVar1);
        dVar7 = (decode_result)jessilib::fold(dVar7.codepoint);
        if (cVar2 != dVar7.codepoint) {
          return false;
        }
      }
      pjVar3 = (jessilib *)dVar7.units;
      pcVar6 = pcVar6 + sVar4;
      this = this + -sVar4;
      sVar5 = sVar5 + 1;
    } while (lhs._M_len != sVar5);
  }
  return this == (jessilib *)0x0;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}